

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

bool duckdb::Catalog::TryAutoLoad(ClientContext *context,string *original_name)

{
  bool bVar1;
  bool bVar2;
  DatabaseInstance *this;
  DBConfig *pDVar3;
  string extension_name;
  string local_30;
  
  ExtensionHelper::ApplyExtensionAlias(&local_30,original_name);
  this = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  bVar1 = DatabaseInstance::ExtensionIsLoaded(this,&local_30);
  bVar2 = true;
  if (!bVar1) {
    pDVar3 = DBConfig::GetConfig(context);
    if ((pDVar3->options).autoload_known_extensions == true) {
      bVar1 = ExtensionHelper::CanAutoloadExtension(&local_30);
      if (bVar1) {
        bVar2 = ExtensionHelper::TryAutoLoadExtension(context,&local_30);
        goto LAB_01246901;
      }
    }
    bVar2 = false;
  }
LAB_01246901:
  ::std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool Catalog::TryAutoLoad(ClientContext &context, const string &original_name) noexcept {
	string extension_name = ExtensionHelper::ApplyExtensionAlias(original_name);
	if (context.db->ExtensionIsLoaded(extension_name)) {
		return true;
	}
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
	auto &dbconfig = DBConfig::GetConfig(context);
	if (!dbconfig.options.autoload_known_extensions) {
		return false;
	}
	try {
		if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
			return ExtensionHelper::TryAutoLoadExtension(context, extension_name);
		}
	} catch (...) {
		return false;
	}
#endif
	return false;
}